

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonObjectCompute(sqlite3_context *ctx,int isFinal)

{
  byte *pbVar1;
  int n;
  ulong uVar2;
  Mem *pMVar3;
  JsonString *p;
  long *p_00;
  
  if ((short)ctx->pMem->flags < 0) {
    p = (JsonString *)ctx->pMem->z;
  }
  else {
    p = (JsonString *)createAggContext(ctx,0);
  }
  if (p == (JsonString *)0x0) {
    setResultStrOrError(ctx,"{}",2,'\x01',(_func_void_void_ptr *)0x0);
  }
  else {
    uVar2 = p->nUsed;
    if (uVar2 < p->nAlloc) {
      p->nUsed = uVar2 + 1;
      p->zBuf[uVar2] = '}';
    }
    else {
      jsonAppendCharExpand(p,'}');
    }
    p->pCtx = ctx;
    if (p->eErr != '\0') {
      jsonReturnString(p,(JsonParse *)0x0,(sqlite3_context *)0x0);
      return;
    }
    if (((ulong)ctx->pFunc->pUserData & 8) != 0) {
      jsonReturnStringAsBlob(p);
      if (isFinal == 0) {
        if (p->eErr != '\0') {
          return;
        }
        p->nUsed = p->nUsed - 1;
        return;
      }
      if (p->bStatic != '\0') {
        return;
      }
      uVar2 = *(ulong *)(p->zBuf + -8);
      p_00 = (long *)(p->zBuf + -8);
      if (1 < uVar2) {
        *p_00 = uVar2 - 1;
        return;
      }
      sqlite3_free(p_00);
      return;
    }
    n = (int)p->nUsed;
    if (isFinal == 0) {
      setResultStrOrError(ctx,p->zBuf,n,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
      if (p->eErr == '\0') {
        p->nUsed = p->nUsed - 1;
      }
    }
    else {
      setResultStrOrError(ctx,p->zBuf,n,'\x01',
                          (_func_void_void_ptr *)(-(ulong)(p->bStatic != '\0') | 0x1439d2));
      p->bStatic = '\x01';
    }
  }
  pMVar3 = ctx->pOut;
  pMVar3->eSubtype = 'J';
  pbVar1 = (byte *)((long)&pMVar3->flags + 1);
  *pbVar1 = *pbVar1 | 8;
  return;
}

Assistant:

static void jsonObjectCompute(sqlite3_context *ctx, int isFinal){
  JsonString *pStr;
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, 0);
  if( pStr ){
    int flags;
    jsonAppendChar(pStr, '}');
    pStr->pCtx = ctx;
    flags = SQLITE_PTR_TO_INT(sqlite3_user_data(ctx));
    if( pStr->eErr ){
      jsonReturnString(pStr, 0, 0);
      return;
    }else if( flags & JSON_BLOB ){
      jsonReturnStringAsBlob(pStr);
      if( isFinal ){
        if( !pStr->bStatic ) sqlite3RCStrUnref(pStr->zBuf);
      }else{
        jsonStringTrimOneChar(pStr);
      }
      return;
    }else if( isFinal ){
      sqlite3_result_text(ctx, pStr->zBuf, (int)pStr->nUsed,
                          pStr->bStatic ? SQLITE_TRANSIENT :
                          sqlite3RCStrUnref);
      pStr->bStatic = 1;
    }else{
      sqlite3_result_text(ctx, pStr->zBuf, (int)pStr->nUsed, SQLITE_TRANSIENT);
      jsonStringTrimOneChar(pStr);
    }
  }else{
    sqlite3_result_text(ctx, "{}", 2, SQLITE_STATIC);
  }
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}